

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeLocalTee(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Index local)

{
  Type type;
  LocalSet *expr;
  undefined1 local_98 [8];
  LocalSet curr;
  undefined1 local_58 [8];
  Result<wasm::Ok> _val;
  
  if (this->func == (Function *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_58,"local.tee is only valid in a function context",
               (allocator<char> *)local_98);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    local_98[0] = (allocator<char>)0x9;
    curr.super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression._id = InvalidId;
    curr.super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression._1_7_ = 0;
    curr.super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression.type.id._0_4_ = local;
    visitExpression((Result<wasm::Ok> *)local_58,this,(Expression *)local_98);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string((string *)&curr.value,(string *)local_58);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&curr.value);
      std::__cxx11::string::~string((string *)&curr.value);
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
      type = Function::getLocalType(this->func,local);
      expr = Builder::makeLocalTee(&this->builder,local,(Expression *)curr._16_8_,type);
      push(this,(Expression *)expr);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeLocalTee(Index local) {
  if (!func) {
    return Err{"local.tee is only valid in a function context"};
  }
  LocalSet curr;
  curr.index = local;
  CHECK_ERR(visitLocalSet(&curr));
  push(builder.makeLocalTee(local, curr.value, func->getLocalType(local)));
  return Ok{};
}